

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# walletutil.h
# Opt level: O2

void __thiscall
wallet::WalletDescriptor::WalletDescriptor
          (WalletDescriptor *this,shared_ptr<Descriptor> descriptor,uint64_t creation_time,
          int32_t range_start,int32_t range_end,int32_t next_index)

{
  long lVar1;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::__shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            ((__shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2> *)this,
             (__shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2> *)
             descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  DescriptorID(&this->id,
               ((__shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2> *)
               descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->_M_ptr
              );
  this->creation_time =
       (uint64_t)
       descriptor.super___shared_ptr<Descriptor,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._M_pi
  ;
  this->range_start = (int32_t)creation_time;
  this->range_end = range_start;
  this->next_index = range_end;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    DescriptorCache::DescriptorCache(&this->cache);
    return;
  }
  __stack_chk_fail();
}

Assistant:

WalletDescriptor(std::shared_ptr<Descriptor> descriptor, uint64_t creation_time, int32_t range_start, int32_t range_end, int32_t next_index) : descriptor(descriptor), id(DescriptorID(*descriptor)), creation_time(creation_time), range_start(range_start), range_end(range_end), next_index(next_index) { }